

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (SelectorSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  bool bVar1;
  optional<int> value;
  undefined8 extraout_RDX;
  RangeSelectSyntax *rs;
  SourceRange range;
  SequenceRange SVar3;
  _Storage<unsigned_int,_true> local_28;
  _Storage<unsigned_int,_true> _Stack_24;
  undefined4 uVar2;
  
  if ((syntax->super_SyntaxNode).kind == BitSelect) {
    value = ASTContext::evalInteger
                      (context,*(ExpressionSyntax **)&syntax[1].super_SyntaxNode,
                       (bitmask<slang::ast::ASTFlags>)0x80000);
    local_28._M_value = 1;
    range = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    bVar1 = ASTContext::requirePositive(context,value,range);
    if (bVar1) {
      local_28._M_value =
           value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      uVar2 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      _Stack_24._M_value = local_28._M_value;
    }
    else {
      uVar2 = 0;
    }
  }
  else {
    SVar3 = fromSyntax((RangeSelectSyntax *)syntax,context,allowUnbounded);
    uVar2 = SVar3.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._4_4_;
    local_28._M_value = SVar3.min;
    _Stack_24._M_value =
         SVar3.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
  }
  SVar3.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_24._M_value;
  SVar3.min = local_28._M_value;
  SVar3.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ = uVar2;
  return SVar3;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const SelectorSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    if (syntax.kind == SyntaxKind::BitSelect) {
        auto val = context.evalInteger(*syntax.as<BitSelectSyntax>().expr,
                                       ASTFlags::AssertionDelayOrRepetition);

        SequenceRange range;
        if (context.requirePositive(val, syntax.sourceRange()))
            range.max = range.min = uint32_t(*val);

        return range;
    }
    else {
        auto& rs = syntax.as<RangeSelectSyntax>();
        return fromSyntax(rs, context, allowUnbounded);
    }
}